

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

InsertOrderedSet<wasm::Name> * __thiscall
wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::operator[]
          (InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *this,Name *k)

{
  pointer ppVar1;
  pair<std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>,_bool>
  pVar2;
  _List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_> local_e8;
  undefined1 local_e0;
  InsertOrderedSet<wasm::Name> local_c8;
  undefined1 local_78 [8];
  pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> kv;
  Name *k_local;
  InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *this_local;
  
  local_c8.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_c8.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl._M_node._M_size =
       0;
  local_c8.Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c8.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_c8.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_c8.Map._M_h._M_rehash_policy._4_4_ = 0;
  local_c8.Map._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8.Map._M_h._M_element_count = 0;
  local_c8.Map._M_h._M_buckets = (__buckets_ptr)0x0;
  local_c8.Map._M_h._M_bucket_count = 0;
  kv.second.List.super__List_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl._M_node._M_size =
       (size_t)k;
  InsertOrderedSet<wasm::Name>::InsertOrderedSet(&local_c8);
  std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::
  pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>,_true>
            ((pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)local_78,k,&local_c8);
  InsertOrderedSet<wasm::Name>::~InsertOrderedSet(&local_c8);
  pVar2 = insert(this,(pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)local_78);
  local_e8 = pVar2.first._M_node;
  local_e0 = pVar2.second;
  ppVar1 = std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>::
           operator->(&local_e8);
  std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::~pair
            ((pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)local_78);
  return &ppVar1->second;
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }